

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3HexToBlob(sqlite3 *db,char *z,int n)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  pvVar1 = sqlite3DbMallocRawNN(db,(ulong)(n / 2 + 1));
  if (pvVar1 != (void *)0x0) {
    if (n < 2) {
      uVar3 = 0;
    }
    else {
      lVar2 = 0;
      uVar3 = 0;
      do {
        *(byte *)((long)pvVar1 + lVar2) =
             ((char)(z[uVar3 + 1] * '\x02') >> 7 & 9U) + z[uVar3 + 1] & 0xf |
             (((char)(z[uVar3] * '\x02') >> 7 & 9U) + z[uVar3]) * '\x10';
        uVar3 = uVar3 + 2;
        lVar2 = lVar2 + 1;
      } while (uVar3 < n - 1);
      uVar3 = (ulong)((uint)lVar2 & 0x7fffffff);
    }
    *(undefined1 *)((long)pvVar1 + uVar3) = 0;
  }
  return pvVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HexToBlob(sqlite3 *db, const char *z, int n){
  char *zBlob;
  int i;

  zBlob = (char *)sqlite3DbMallocRawNN(db, n/2 + 1);
  n--;
  if( zBlob ){
    for(i=0; i<n; i+=2){
      zBlob[i/2] = (sqlite3HexToInt(z[i])<<4) | sqlite3HexToInt(z[i+1]);
    }
    zBlob[i/2] = 0;
  }
  return zBlob;
}